

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

string * deqp::gles3::Performance::anon_unknown_1::DeadCodeEliminationCase::
         deadBranchComplexCaseStatements
                   (string *__return_storage_ptr__,bool optimized,string *precision,bool useConst,
                   bool useHeavierWorkload)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined7 in_register_00000009;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  char *pcVar8;
  undefined7 in_register_00000031;
  char *pcVar9;
  ulong uVar10;
  undefined7 in_register_00000081;
  string constMaybe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  long *local_3a8;
  undefined8 local_3a0;
  long local_398;
  undefined8 uStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  ulong *local_368;
  long local_360;
  ulong local_358 [2];
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar9 = "";
  iVar4 = (int)CONCAT71(in_register_00000009,useConst);
  if (iVar4 != 0) {
    pcVar9 = "const ";
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  pcVar8 = pcVar9 + 6;
  if (iVar4 == 0) {
    pcVar8 = pcVar9;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,pcVar9,pcVar8);
  iVar4 = 4;
  if ((int)CONCAT71(in_register_00000081,useHeavierWorkload) != 0) {
    iVar4 = 0x10;
  }
  if ((int)CONCAT71(in_register_00000031,optimized) != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n","");
    goto LAB_012fc124;
  }
  std::operator+(&local_1c8,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\t",&local_3c8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1c8,(ulong)(precision->_M_dataplus)._M_p);
  local_348 = &local_338;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_338 = *plVar5;
    lStack_330 = plVar2[3];
  }
  else {
    local_338 = *plVar5;
    local_348 = (long *)*plVar2;
  }
  local_340 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
  local_328 = &local_318;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_318 = *plVar5;
    lStack_310 = plVar2[3];
  }
  else {
    local_318 = *plVar5;
    local_328 = (long *)*plVar2;
  }
  local_320 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_328,(ulong)local_3c8._M_dataplus._M_p);
  local_308 = &local_2f8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_2f8 = *plVar5;
    lStack_2f0 = plVar2[3];
  }
  else {
    local_2f8 = *plVar5;
    local_308 = (long *)*plVar2;
  }
  local_300 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_308,(ulong)(precision->_M_dataplus)._M_p);
  local_2e8 = &local_2d8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_2d8 = *plVar5;
    lStack_2d0 = plVar2[3];
  }
  else {
    local_2d8 = *plVar5;
    local_2e8 = (long *)*plVar2;
  }
  local_2e0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_2c8 = &local_2b8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_2b8 = *plVar5;
    lStack_2b0 = plVar2[3];
  }
  else {
    local_2b8 = *plVar5;
    local_2c8 = (long *)*plVar2;
  }
  local_2c0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2c8,(ulong)local_3c8._M_dataplus._M_p);
  local_2a8 = &local_298;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_298 = *plVar5;
    lStack_290 = plVar2[3];
  }
  else {
    local_298 = *plVar5;
    local_2a8 = (long *)*plVar2;
  }
  local_2a0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  local_288 = &local_278;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_278 = *plVar5;
    lStack_270 = plVar2[3];
  }
  else {
    local_278 = *plVar5;
    local_288 = (long *)*plVar2;
  }
  local_280 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_288,(ulong)local_3c8._M_dataplus._M_p);
  local_268 = &local_258;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_258 = *plVar5;
    lStack_250 = plVar2[3];
  }
  else {
    local_258 = *plVar5;
    local_268 = (long *)*plVar2;
  }
  local_260 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_268,(ulong)(precision->_M_dataplus)._M_p);
  local_248 = &local_238;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_238 = *plVar5;
    lStack_230 = plVar2[3];
  }
  else {
    local_238 = *plVar5;
    local_248 = (long *)*plVar2;
  }
  local_240 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_228 = &local_218;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_218 = *plVar5;
    lStack_210 = plVar2[3];
  }
  else {
    local_218 = *plVar5;
    local_228 = (long *)*plVar2;
  }
  local_220 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_228,(ulong)local_3c8._M_dataplus._M_p);
  local_208 = &local_1f8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_1f8 = *plVar5;
    lStack_1f0 = plVar2[3];
  }
  else {
    local_1f8 = *plVar5;
    local_208 = (long *)*plVar2;
  }
  local_200 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)(precision->_M_dataplus)._M_p);
  local_1e8 = &local_1d8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_1d8 = *plVar5;
    lStack_1d0 = plVar2[3];
  }
  else {
    local_1d8 = *plVar5;
    local_1e8 = (long *)*plVar2;
  }
  local_1e0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_378 = *puVar6;
    lStack_370 = plVar2[3];
    local_388 = &local_378;
  }
  else {
    local_378 = *puVar6;
    local_388 = (ulong *)*plVar2;
  }
  local_380 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,iVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar10 = 0xf;
  if (local_388 != &local_378) {
    uVar10 = local_378;
  }
  if (uVar10 < (ulong)(local_360 + local_380)) {
    uVar10 = 0xf;
    if (local_368 != local_358) {
      uVar10 = local_358[0];
    }
    if (uVar10 < (ulong)(local_360 + local_380)) goto LAB_012fc06e;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_388);
  }
  else {
LAB_012fc06e:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_368);
  }
  local_3a8 = &local_398;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_398 = *plVar2;
    uStack_390 = puVar3[3];
  }
  else {
    local_398 = *plVar2;
    local_3a8 = (long *)*puVar3;
  }
  local_3a0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar7) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
LAB_012fc124:
  if (!optimized) {
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,local_398 + 1);
    }
    if (local_368 != local_358) {
      operator_delete(local_368,local_358[0] + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,local_378 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string deadBranchComplexCaseStatements (bool optimized, const string& precision, bool useConst, bool useHeavierWorkload)
	{
		const string	constMaybe			= useConst ? "const " : "";
		const int		numLoopIterations	= useHeavierWorkload ? 16 : 4;

		return optimized ?	"	value = vec4(0.6, 0.7, 0.8, 0.9) * value;\n"

						 :	"	value = vec4(0.6, 0.7, 0.8, 0.9) * value;\n"
							"	" + constMaybe + precision + " vec4 a = vec4(sin(0.7), cos(0.2), sin(0.9), abs(-0.5));\n"
							"	" + constMaybe + precision + " vec4 b = cos(a) + fract(3.0*a.xzzw);\n"
							"	" + constMaybe + "bvec4 c = bvec4(true, false, true, true);\n"
							"	" + constMaybe + precision + " vec4 d = exp(b + vec4(c));\n"
							"	" + constMaybe + precision + " vec4 e = 1.8*abs(sin(sin(inversesqrt(mix(d+a, d+b, a)))));\n"
							"	if (e.x > 1.0)\n"
							"	{\n"
							"		value = cos(exp(sin(value))*log(sqrt(value)));\n"
							"		for (int i = 0; i < " + toString(numLoopIterations) + "; i++)\n"
							"			value = sin(value);\n"
							"	}\n";
	}